

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

int QuaternionEquals(Quaternion p,Quaternion q)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar2 = p.x;
  fVar7 = p.y;
  fVar3 = q.x;
  fVar9 = ABS(fVar2);
  fVar4 = q.y;
  fVar12 = ABS(fVar3);
  fVar13 = fVar12;
  if (fVar12 <= fVar9) {
    fVar13 = fVar9;
  }
  fVar13 = (float)(~-(uint)NAN(fVar9) & (uint)fVar13 | -(uint)NAN(fVar9) & (uint)fVar12);
  if (fVar13 <= 1.0) {
    fVar13 = 1.0;
  }
  fVar9 = p.z;
  fVar6 = q.w;
  fVar5 = q.z;
  fVar12 = p.w;
  if (ABS(fVar2 - fVar3) <= fVar13 * 1e-06) {
    fVar8 = ABS(fVar7);
    fVar10 = ABS(fVar4);
    fVar11 = fVar10;
    if (fVar10 <= fVar8) {
      fVar11 = fVar8;
    }
    fVar11 = (float)(~-(uint)NAN(fVar8) & (uint)fVar11 | -(uint)NAN(fVar8) & (uint)fVar10);
    if (fVar11 <= 1.0) {
      fVar11 = 1.0;
    }
    if (ABS(fVar7 - fVar4) <= fVar11 * 1e-06) {
      fVar8 = ABS(fVar9);
      fVar10 = ABS(fVar5);
      fVar11 = fVar10;
      if (fVar10 <= fVar8) {
        fVar11 = fVar8;
      }
      fVar11 = (float)(~-(uint)NAN(fVar8) & (uint)fVar11 | -(uint)NAN(fVar8) & (uint)fVar10);
      if (fVar11 <= 1.0) {
        fVar11 = 1.0;
      }
      if (ABS(fVar9 - fVar5) <= fVar11 * 1e-06) {
        fVar8 = ABS(fVar12);
        fVar10 = ABS(fVar6);
        fVar11 = fVar10;
        if (fVar10 <= fVar8) {
          fVar11 = fVar8;
        }
        fVar11 = (float)(~-(uint)NAN(fVar8) & (uint)fVar11 | -(uint)NAN(fVar8) & (uint)fVar10);
        if (fVar11 <= 1.0) {
          fVar11 = 1.0;
        }
        if (ABS(fVar12 - fVar6) <= fVar11 * 1e-06) {
          return 1;
        }
      }
    }
  }
  uVar1 = 0;
  if (ABS(fVar2 + fVar3) <= fVar13 * 1e-06) {
    fVar2 = ABS(fVar7);
    fVar3 = ABS(fVar4);
    fVar13 = fVar3;
    if (fVar3 <= fVar2) {
      fVar13 = fVar2;
    }
    fVar13 = (float)(~-(uint)NAN(fVar2) & (uint)fVar13 | -(uint)NAN(fVar2) & (uint)fVar3);
    if (fVar13 <= 1.0) {
      fVar13 = 1.0;
    }
    if (ABS(fVar7 + fVar4) <= fVar13 * 1e-06) {
      fVar2 = ABS(fVar9);
      fVar7 = ABS(fVar5);
      fVar13 = fVar7;
      if (fVar7 <= fVar2) {
        fVar13 = fVar2;
      }
      fVar13 = (float)(~-(uint)NAN(fVar2) & (uint)fVar13 | -(uint)NAN(fVar2) & (uint)fVar7);
      if (fVar13 <= 1.0) {
        fVar13 = 1.0;
      }
      if (ABS(fVar9 + fVar5) <= fVar13 * 1e-06) {
        fVar2 = ABS(fVar12);
        fVar7 = ABS(fVar6);
        fVar13 = fVar7;
        if (fVar7 <= fVar2) {
          fVar13 = fVar2;
        }
        fVar13 = (float)(~-(uint)NAN(fVar2) & (uint)fVar13 | -(uint)NAN(fVar2) & (uint)fVar7);
        if (fVar13 <= 1.0) {
          fVar13 = 1.0;
        }
        uVar1 = (uint)(ABS(fVar12 + fVar6) <= fVar13 * 1e-06);
      }
    }
  }
  return uVar1;
}

Assistant:

RMAPI int QuaternionEquals(Quaternion p, Quaternion q)
{
#if !defined(EPSILON)
    #define EPSILON 0.000001f
#endif

    int result = (((fabsf(p.x - q.x)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.x), fabsf(q.x))))) &&
                  ((fabsf(p.y - q.y)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.y), fabsf(q.y))))) &&
                  ((fabsf(p.z - q.z)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.z), fabsf(q.z))))) &&
                  ((fabsf(p.w - q.w)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.w), fabsf(q.w)))))) ||
                 (((fabsf(p.x + q.x)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.x), fabsf(q.x))))) &&
                  ((fabsf(p.y + q.y)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.y), fabsf(q.y))))) &&
                  ((fabsf(p.z + q.z)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.z), fabsf(q.z))))) &&
                  ((fabsf(p.w + q.w)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.w), fabsf(q.w))))));

    return result;
}